

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodecTests.cc
# Opt level: O3

void avro::testLimitsJsonCodec(void)

{
  ValidSchema schema;
  DecoderPtr DStack_38;
  EncoderPtr local_28;
  parsing local_18 [8];
  shared_count local_10;
  
  parsing::makeValidSchema
            (local_18,
             "{ \"type\": \"record\", \"name\": \"r\", \"fields\": [{ \"name\": \"d1\", \"type\": \"double\" },{ \"name\": \"d2\", \"type\": \"double\" },{ \"name\": \"d3\", \"type\": \"double\" },{ \"name\": \"f1\", \"type\": \"float\" },{ \"name\": \"f2\", \"type\": \"float\" },{ \"name\": \"f3\", \"type\": \"float\" }]}"
            );
  avro::jsonEncoder((ValidSchema *)&local_28);
  avro::jsonDecoder((ValidSchema *)&DStack_38);
  testLimits(&local_28,&DStack_38);
  boost::detail::shared_count::~shared_count(&DStack_38.pn);
  boost::detail::shared_count::~shared_count(&local_28.pn);
  boost::detail::shared_count::~shared_count(&local_10);
  return;
}

Assistant:

static void testLimitsJsonCodec()
{
    const char* s = "{ \"type\": \"record\", \"name\": \"r\", \"fields\": ["
        "{ \"name\": \"d1\", \"type\": \"double\" },"
        "{ \"name\": \"d2\", \"type\": \"double\" },"
        "{ \"name\": \"d3\", \"type\": \"double\" },"
        "{ \"name\": \"f1\", \"type\": \"float\" },"
        "{ \"name\": \"f2\", \"type\": \"float\" },"
        "{ \"name\": \"f3\", \"type\": \"float\" }"
    "]}";
    ValidSchema schema = parsing::makeValidSchema(s);
    testLimits(jsonEncoder(schema), jsonDecoder(schema));
}